

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20250127::debugging_internal::ParseTemplateParamDecl(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  ParseState copy;
  
  iVar7 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar7 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar7) {
    bVar8 = false;
    goto LAB_002f17e9;
  }
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar6 = ParseTwoCharToken(state,"Ty");
  bVar8 = true;
  if (!bVar6) {
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"Tk");
    if (bVar6) {
      bVar6 = ParseName(state);
      if (bVar6) {
        ParseTemplateArgs(state);
        goto LAB_002f17e4;
      }
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"Tn");
    if (bVar6) {
      bVar6 = ParseType(state);
      if (bVar6) goto LAB_002f17e4;
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"Tt");
    if (bVar6) {
      do {
        bVar6 = ParseTemplateParamDecl(state);
      } while (bVar6);
      bVar6 = ParseOneCharToken(state,'E');
      if (bVar6) goto LAB_002f17e4;
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"Tp");
    if (bVar6) {
      bVar6 = ParseTemplateParamDecl(state);
      if (bVar6) goto LAB_002f17e4;
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar8 = false;
  }
LAB_002f17e4:
  iVar7 = state->recursion_depth + -1;
LAB_002f17e9:
  state->recursion_depth = iVar7;
  return bVar8;
}

Assistant:

static bool ParseTemplateParamDecl(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  if (ParseTwoCharToken(state, "Ty")) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Tk") && ParseName(state) &&
      Optional(ParseTemplateArgs(state))) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Tn") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Tt") &&
      ZeroOrMore(ParseTemplateParamDecl, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Tp") && ParseTemplateParamDecl(state)) {
    return true;
  }
  state->parse_state = copy;

  return false;
}